

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_dest(ASMState *as,IRIns *ir,RegSet allow)

{
  byte bVar1;
  uint uVar2;
  uint in_EDX;
  ASMState *in_RSI;
  long in_RDI;
  Reg dest;
  
  bVar1 = *(byte *)((long)in_RSI->cost + 6);
  uVar2 = (uint)bVar1;
  if ((bVar1 & 0x80) == 0) {
    *(uint *)(in_RDI + 0xa8) = 1 << (bVar1 & 0x1f) | *(uint *)(in_RDI + 0xa8);
    *(uint *)(in_RDI + 0xac) = 1 << (bVar1 & 0x1f) | *(uint *)(in_RDI + 0xac);
  }
  else {
    if ((uVar2 < 0xfd) && (((*(uint *)(in_RDI + 0xa8) & in_EDX) >> (bVar1 & 0x1f) & 1) != 0)) {
      uVar2 = uVar2 & 0x7f;
      *(uint *)(in_RDI + 0xac) = 1 << ((byte)uVar2 & 0x1f) | *(uint *)(in_RDI + 0xac);
    }
    else {
      uVar2 = ra_scratch(in_RSI,in_EDX);
    }
    *(char *)((long)in_RSI->cost + 6) = (char)uVar2;
  }
  if (*(char *)((long)in_RSI->cost + 7) != '\0') {
    ra_save(in_RSI,(IRIns *)CONCAT44(in_EDX,uVar2),0);
  }
  return uVar2;
}

Assistant:

static Reg ra_dest(ASMState *as, IRIns *ir, RegSet allow)
{
  Reg dest = ir->r;
  if (ra_hasreg(dest)) {
    ra_free(as, dest);
    ra_modified(as, dest);
  } else {
    if (ra_hashint(dest) && rset_test((as->freeset&allow), ra_gethint(dest))) {
      dest = ra_gethint(dest);
      ra_modified(as, dest);
      RA_DBGX((as, "dest           $r", dest));
    } else {
      dest = ra_scratch(as, allow);
    }
    ir->r = dest;
  }
  if (LJ_UNLIKELY(ra_hasspill(ir->s))) ra_save(as, ir, dest);
  return dest;
}